

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O3

optional<unsigned_short> __thiscall
jbcoin::STObject::operator[]<jbcoin::STInteger<unsigned_short>>
          (STObject *this,OptionaledField<jbcoin::STInteger<unsigned_short>_> *of)

{
  STBase *pSVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  iVar2 = getFieldIndex(this,&of->f->super_SField);
  uVar3 = 0;
  if (iVar2 == -1) {
    uVar5 = 0;
  }
  else {
    pSVar1 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2].p_;
    uVar5 = 0;
    if (pSVar1 != (STBase *)0x0) {
      lVar4 = __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_short>::typeinfo,0);
      if (lVar4 == 0) {
        if (this->mType == (SOTemplate *)0x0) {
          __assert_fail("mType",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STObject.h"
                        ,0x393,
                        "boost::optional<std::decay_t<typename T::value_type>> jbcoin::STObject::operator[](const OptionaledField<T> &) const [T = jbcoin::STInteger<unsigned short>]"
                       );
        }
        iVar2 = (*pSVar1->_vptr_STBase[4])(pSVar1);
        if (iVar2 != 0) {
          __assert_fail("b->getSType() == STI_NOTPRESENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STObject.h"
                        ,0x394,
                        "boost::optional<std::decay_t<typename T::value_type>> jbcoin::STObject::operator[](const OptionaledField<T> &) const [T = jbcoin::STInteger<unsigned short>]"
                       );
        }
        iVar2 = *(int *)((long)(this->mType->mTypes).
                               super__Vector_base<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>,_std::allocator<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(this->mType->mIndex).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start
                                [(of->f->super_SField).fieldNum]]._M_t.
                               super___uniq_ptr_impl<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>
                        + 8);
        uVar5 = 0;
        if (iVar2 == 1) {
          uVar3 = 0;
          goto LAB_001e2ae1;
        }
        if (iVar2 != 2) {
          __assert_fail("mType->style(*of.f) == SOE_DEFAULT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STObject.h"
                        ,0x397,
                        "boost::optional<std::decay_t<typename T::value_type>> jbcoin::STObject::operator[](const OptionaledField<T> &) const [T = jbcoin::STInteger<unsigned short>]"
                       );
        }
      }
      else {
        uVar5 = *(int *)(lVar4 + 0x10) << 0x10;
      }
      uVar3 = 1;
    }
  }
LAB_001e2ae1:
  return (optional<unsigned_short>)(type)(uVar3 | uVar5);
}

Assistant:

boost::optional<std::decay_t<typename T::value_type>>
STObject::operator[](OptionaledField<T> const& of) const
{
    auto const b = peekAtPField(*of.f);
    if (! b)
        return boost::none;
    auto const u =
        dynamic_cast<T const*>(b);
    if (! u)
    {
        assert(mType);
        assert(b->getSType() == STI_NOTPRESENT);
        if(mType->style(*of.f) == SOE_OPTIONAL)
            return boost::none;
        assert(mType->style(*of.f) == SOE_DEFAULT);
        return typename T::value_type{};
    }
    return u->value();
}